

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O0

void __thiscall LibClass::LibClass(LibClass *this)

{
  double *pdVar1;
  LibInternalClass *this_00;
  LibClass *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::vector(&this->m_Vec);
  std::__cxx11::string::operator=((string *)this,"TestClass2");
  this->m_Num = 1000;
  pdVar1 = (double *)operator_new(8);
  *pdVar1 = 1.2345;
  this->m_DoublePtr = pdVar1;
  this_00 = (LibInternalClass *)operator_new(8);
  LibInternalClass::LibInternalClass(this_00);
  this->m_InnerMember = this_00;
  return;
}

Assistant:

LibClass::LibClass() {
    m_Str = "TestClass2";
    m_Num = 1000;
    m_DoublePtr = new double(1.2345);
    m_InnerMember = new LibInternalClass();
}